

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleRoot.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::ModuleRoot::GetItemQuery
          (ModuleRoot *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  PropertyQueryFlags val;
  BOOL BVar1;
  HostObjectBase **ppHVar2;
  RecyclableObject *pRVar3;
  ScriptContext *requestContext_local;
  Var *value_local;
  uint32 index_local;
  Var originalInstance_local;
  ModuleRoot *this_local;
  
  val = DynamicObject::GetItemQuery
                  ((DynamicObject *)this,originalInstance,index,value,requestContext);
  BVar1 = JavascriptConversion::PropertyQueryFlagsToBoolean(val);
  if (BVar1 == 0) {
    ppHVar2 = Memory::WriteBarrierPtr::operator_cast_to_HostObjectBase__
                        ((WriteBarrierPtr *)&(this->super_RootObjectBase).hostObject);
    if (*ppHVar2 != (HostObjectBase *)0x0) {
      pRVar3 = (RecyclableObject *)
               Memory::WriteBarrierPtr<Js::HostObjectBase>::operator->
                         (&(this->super_RootObjectBase).hostObject);
      BVar1 = RecyclableObject::GetItem(pRVar3,originalInstance,index,value,requestContext);
      if (BVar1 != 0) {
        return Property_Found;
      }
    }
    pRVar3 = ScriptContext::GetMissingItemResult(requestContext);
    *value = pRVar3;
    this_local._4_4_ = Property_NotFound;
  }
  else {
    this_local._4_4_ = Property_Found;
  }
  return this_local._4_4_;
}

Assistant:

PropertyQueryFlags ModuleRoot::GetItemQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::GetItemQuery(originalInstance, index, value, requestContext)))
        {
            return PropertyQueryFlags::Property_Found;
        }
        if (this->hostObject && this->hostObject->GetItem(originalInstance, index, value, requestContext))
        {
            return PropertyQueryFlags::Property_Found;
        }
        *value = requestContext->GetMissingItemResult();
        return PropertyQueryFlags::Property_NotFound;
    }